

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant
          (ScalarEvolutionAnalysis *this,Instruction *inst)

{
  byte bVar1;
  IRContext *this_00;
  ConstantManager *pCVar2;
  int iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  SENode *pSVar6;
  const_iterator cVar7;
  ScalarConstant *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar8;
  ulong integer;
  uint32_t local_1c;
  
  if (inst->opcode_ != OpConstant) {
    if (inst->opcode_ != OpConstantNull) {
      __assert_fail("inst->opcode() == spv::Op::OpConstant",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                    ,200,
                    "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction *)"
                   );
    }
    pSVar6 = CreateConstant(this,0);
    return pSVar6;
  }
  bVar1 = inst->has_result_id_;
  uVar8 = (bVar1 & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar8 = (uint)bVar1;
  }
  if ((int)((ulong)((long)(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar8 == 1
     ) {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(this_00);
      bVar1 = inst->has_result_id_;
    }
    pCVar2 = (this_00->constant_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
    local_1c = 0;
    if ((bVar1 & 1) != 0) {
      local_1c = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    }
    cVar7 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(pCVar2->id_to_const_val_)._M_h,&local_1c);
    if ((((cVar7.
           super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (*(long **)((long)cVar7.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                           ._M_cur + 0x10) != (long *)0x0)) &&
        (this_01 = (ScalarConstant *)
                   (**(code **)(**(long **)((long)cVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                                                  ._M_cur + 0x10) + 0x70))(),
        this_01 != (ScalarConstant *)0x0)) &&
       (iVar3 = (*(this_01->super_Constant)._vptr_Constant[0x18])(this_01),
       ((long *)CONCAT44(extraout_var,iVar3))[1] - *(long *)CONCAT44(extraout_var,iVar3) == 4)) {
      iVar3 = (*((this_01->super_Constant).type_)->_vptr_Type[10])();
      if (*(char *)(CONCAT44(extraout_var_00,iVar3) + 0x28) == '\x01') {
        iVar4 = analysis::IntConstant::GetS32BitValue((IntConstant *)this_01);
        integer = (ulong)iVar4;
      }
      else {
        uVar5 = analysis::ScalarConstant::GetU32BitValue(this_01);
        integer = (ulong)uVar5;
      }
      pSVar6 = CreateConstant(this,integer);
      return pSVar6;
    }
    return this->cached_cant_compute_;
  }
  __assert_fail("inst->NumInOperands() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                ,0xc9,
                "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction *)"
               );
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction* inst) {
  if (inst->opcode() == spv::Op::OpConstantNull) return CreateConstant(0);

  assert(inst->opcode() == spv::Op::OpConstant);
  assert(inst->NumInOperands() == 1);
  int64_t value = 0;

  // Look up the instruction in the constant manager.
  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(inst->result_id());

  if (!constant) return CreateCantComputeNode();

  const analysis::IntConstant* int_constant = constant->AsIntConstant();

  // Exit out if it is a 64 bit integer.
  if (!int_constant || int_constant->words().size() != 1)
    return CreateCantComputeNode();

  if (int_constant->type()->AsInteger()->IsSigned()) {
    value = int_constant->GetS32BitValue();
  } else {
    value = int_constant->GetU32BitValue();
  }

  return CreateConstant(value);
}